

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::DirectStateAccess::Textures::BindUnitTest::DataToString_abi_cxx11_
          (string *__return_storage_ptr__,BindUnitTest *this,GLuint count,GLubyte *data)

{
  ulong uVar1;
  bool bVar2;
  stringstream int_sstream;
  long *local_1e0;
  long local_1d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (count != 0) {
    uVar1 = 1;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1e0);
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      bVar2 = uVar1 != count;
      uVar1 = uVar1 + 1;
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BindUnitTest::DataToString(glw::GLuint count, const glw::GLubyte data[])
{
	std::string data_str = "[";

	for (glw::GLuint i = 0; i < count; ++i)
	{
		std::stringstream int_sstream;

		int_sstream << unsigned(data[i]);

		data_str.append(int_sstream.str());

		if (i + 1 < count)
		{
			data_str.append(", ");
		}
		else
		{
			data_str.append("]");
		}
	}

	return data_str;
}